

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomReporter.cpp
# Opt level: O0

shared_ptr<ApprovalTests::GenericDiffReporter>
ApprovalTests::CustomReporter::createForegroundReporter
          (string *path,string *arguments,Type type,bool allowNonZeroExitCodes)

{
  element_type *peVar1;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  byte in_R8B;
  shared_ptr<ApprovalTests::GenericDiffReporter> sVar2;
  DiffInfo info;
  shared_ptr<ApprovalTests::GenericDiffReporter> *reporter;
  element_type *peVar3;
  string *program_;
  DiffInfo *this;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  DiffInfo local_a8;
  byte local_1d;
  
  local_1d = in_R8B & 1;
  program_ = &local_a8.arguments;
  peVar3 = in_RDI;
  ::std::__cxx11::string::string((string *)program_,in_RSI);
  this = &local_a8;
  ::std::__cxx11::string::string((string *)this,(string *)in_RDX);
  DiffInfo::DiffInfo(this,program_,in_RDX,(Type)((ulong)peVar3 >> 0x20));
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8.arguments);
  ::std::make_shared<ApprovalTests::GenericDiffReporter,ApprovalTests::DiffInfo&>
            ((DiffInfo *)
             (CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48) & 0xffffffff00ffffff));
  peVar1 = ::std::
           __shared_ptr_access<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x17312e);
  SystemLauncher::setForeground(&peVar1->launcher,true);
  peVar1 = ::std::
           __shared_ptr_access<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x17314b);
  SystemLauncher::setAllowNonZeroExitCodes(&peVar1->launcher,(bool)(local_1d & 1));
  DiffInfo::~DiffInfo((DiffInfo *)in_RDI);
  sVar2.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar3;
  return (shared_ptr<ApprovalTests::GenericDiffReporter>)
         sVar2.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericDiffReporter> CustomReporter::createForegroundReporter(
        std::string path, std::string arguments, Type type, bool allowNonZeroExitCodes)
    {
        DiffInfo info(std::move(path), std::move(arguments), type);
        auto reporter = std::make_shared<GenericDiffReporter>(info);
        reporter->launcher.setForeground(true);
        reporter->launcher.setAllowNonZeroExitCodes(allowNonZeroExitCodes);
        return reporter;
    }